

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

ClassSpecifierSyntax * __thiscall slang::parsing::Parser::parseClassSpecifier(Parser *this)

{
  Token keyword_00;
  Token colon_00;
  string_view arg;
  bool bVar1;
  SourceLocation SVar2;
  undefined8 in_RDI;
  Token TVar3;
  Token TVar4;
  SourceRange range;
  ClassSpecifierSyntax *result;
  Token keyword;
  Token colon;
  ParserBase *in_stack_ffffffffffffff18;
  undefined6 in_stack_ffffffffffffff20;
  undefined2 in_stack_ffffffffffffff26;
  undefined6 uVar5;
  TokenKind kind;
  ParserBase *in_stack_ffffffffffffff30;
  ParserBase *in_stack_ffffffffffffff38;
  ParserBase *in_stack_ffffffffffffff40;
  DiagCode code;
  ParserBase *this_00;
  Diagnostic *local_48;
  TokenKind local_40;
  Diagnostic *local_28;
  size_t local_20;
  ClassSpecifierSyntax *local_8;
  
  uVar5 = (undefined6)in_RDI;
  kind = (TokenKind)((ulong)in_RDI >> 0x30);
  bVar1 = ParserBase::peek(in_stack_ffffffffffffff30,kind);
  if (bVar1) {
    TVar3 = ParserBase::consume(in_stack_ffffffffffffff40);
    Token::Token((Token *)CONCAT26(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20));
    TVar4 = ParserBase::peek(in_stack_ffffffffffffff18);
    local_40 = TVar4.kind;
    this_00 = (ParserBase *)TVar3.info;
    if (local_40 == Identifier) {
      std::optional<slang::DiagCode>::optional<const_slang::DiagCode_&,_true>
                ((optional<slang::DiagCode> *)CONCAT26(2,in_stack_ffffffffffffff20),
                 (DiagCode *)in_stack_ffffffffffffff18);
      ParserBase::skipToken
                (this_00,(_Optional_base<slang::DiagCode,_true,_true>)SUB86((ulong)in_RDI >> 0x10,0)
                );
    }
    else if (((local_40 == ExtendsKeyword) || (local_40 == FinalKeyword)) ||
            (local_40 == InitialKeyword)) {
      TVar4 = ParserBase::consume(in_stack_ffffffffffffff40);
      local_48 = (Diagnostic *)TVar4.info;
      local_28 = local_48;
    }
    else {
      TVar4 = ParserBase::peek(in_stack_ffffffffffffff18);
      SVar2 = Token::location((Token *)&stack0xffffffffffffff80);
      ParserBase::addDiag(TVar4._0_8_,SVar2._4_4_,(SourceLocation)TVar4.info);
    }
    local_20 = TVar3._0_8_;
    colon_00.rawLen._2_2_ = kind;
    colon_00._0_6_ = uVar5;
    colon_00.info = (Info *)in_stack_ffffffffffffff30;
    keyword_00.info._0_6_ = in_stack_ffffffffffffff20;
    keyword_00._0_8_ = in_stack_ffffffffffffff18;
    keyword_00.info._6_2_ = local_40;
    local_8 = slang::syntax::SyntaxFactory::classSpecifier
                        ((SyntaxFactory *)0x8d062f,colon_00,keyword_00);
    if ((*(int *)(CONCAT26(kind,uVar5) + 0xf4) < 1) &&
       (bVar1 = Token::operator_cast_to_bool((Token *)0x8d0652), bVar1)) {
      code.subsystem = General;
      code.code = 2;
      range = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_00);
      ParserBase::addDiag(in_stack_ffffffffffffff38,code,range);
      slang::toString(Default);
      arg._M_str = (char *)this_00;
      arg._M_len = local_20;
      Diagnostic::operator<<(local_28,arg);
    }
  }
  else {
    local_8 = (ClassSpecifierSyntax *)0x0;
  }
  return local_8;
}

Assistant:

ClassSpecifierSyntax* Parser::parseClassSpecifier() {
    if (peek(TokenKind::Colon)) {
        auto colon = consume();

        Token keyword;
        switch (peek().kind) {
            case TokenKind::InitialKeyword:
            case TokenKind::ExtendsKeyword:
            case TokenKind::FinalKeyword:
                keyword = consume();
                break;
            case TokenKind::Identifier:
                skipToken(diag::ExpectedClassSpecifier);
                break;
            default:
                addDiag(diag::ExpectedClassSpecifier, peek().location());
                break;
        }

        auto& result = factory.classSpecifier(colon, keyword);
        if (parseOptions.languageVersion < LanguageVersion::v1800_2023 && keyword) {
            addDiag(diag::WrongLanguageVersion, result.sourceRange())
                << toString(parseOptions.languageVersion);
        }

        return &result;
    }
    return nullptr;
}